

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Parser_members.cpp
# Opt level: O2

PathDeclarationSyntax * __thiscall slang::parsing::Parser::parsePathDeclaration(Parser *this)

{
  TokenKind kind;
  bool bVar1;
  bool bVar2;
  int iVar3;
  ExpressionSyntax *pEVar5;
  EdgeSensitivePathSuffixSyntax *suffix;
  PathDescriptionSyntax *desc;
  Info *pIVar6;
  SourceLocation SVar7;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  PathDeclarationSyntax *pPVar9;
  SyntaxNode *this_00;
  Info *pIVar10;
  Info *extraout_RDX;
  Info *extraout_RDX_00;
  ulong extraout_RDX_01;
  ulong extraout_RDX_02;
  TokenKind TVar11;
  ulong uVar12;
  BumpAllocator *pBVar13;
  TokenOrSyntax *this_01;
  TokenKind TVar14;
  Token TVar15;
  Token TVar16;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> sVar17;
  span<const_slang::parsing::Trivia,_18446744073709551615UL> sVar18;
  span<slang::syntax::TokenOrSyntax,_18446744073709551615UL> sVar19;
  Token TVar20;
  SourceRange range;
  Token polarityOperator;
  Token openParen;
  Token edgeIdentifier;
  Token equals;
  Token local_2d8;
  Info *local_2c8;
  PathDescriptionSyntax *local_2c0;
  Info *local_2b8;
  __extent_storage<18446744073709551615UL> local_2b0;
  anon_class_8_1_8991fb9c checkTerminals;
  Token valueCloseParen;
  Token local_290;
  Token local_280;
  undefined8 local_270;
  Token current;
  _Variadic_union<slang::parsing::Token,_const_slang::syntax::SyntaxNode_*> local_258;
  ulong local_248;
  undefined8 uStack_240;
  ulong local_238;
  long local_230;
  ulong local_228;
  Token valueOpenParen;
  anon_class_8_1_8991fb9c parsePolarity;
  SmallVector<slang::syntax::TokenOrSyntax,_4UL> buffer;
  undefined8 uVar4;
  long lVar8;
  
  checkTerminals.this = this;
  parsePolarity.this = this;
  TVar15 = ParserBase::expect(&this->super_ParserBase,OpenParenthesis);
  uVar4 = TVar15._0_8_;
  TVar16 = parseEdgeKeyword(this);
  local_2c8 = TVar16.info;
  sVar17 = parsePathTerminals(this);
  local_2b0 = sVar17._M_extent._M_extent_value;
  local_280 = parsePathDeclaration::anon_class_8_1_8991fb9c::operator()(&parsePolarity);
  pIVar10 = local_280.info;
  Token::Token(&local_2d8);
  local_2c0 = TVar16._0_8_;
  local_2b8 = TVar15.info;
  if ((pIVar10 == (Info *)0x0) &&
     ((bVar2 = ParserBase::peek(&this->super_ParserBase,PlusEqual), bVar2 ||
      (bVar2 = ParserBase::peek(&this->super_ParserBase,MinusEqual), bVar2)))) {
    local_280 = ParserBase::consume(&this->super_ParserBase);
    local_2d8 = ParserBase::consumeIf(&this->super_ParserBase,GreaterThan);
    if (local_2d8.info == (Info *)0x0) {
      SVar7 = Token::location(&local_280);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x4b0005,
                          (SourceLocation)
                          ((long)SVar7 * 0x10 + 0x100000000 >> 4 & 0xfffffffff0000000U |
                          (ulong)(SVar7._0_4_ & 0xfffffff)));
      buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>._0_16_ =
           ParserBase::peek(&this->super_ParserBase);
      SVar7 = Token::location((Token *)&buffer);
      kind = GreaterThan;
LAB_003e63a6:
      local_2d8 = ParserBase::missingToken(&this->super_ParserBase,kind,SVar7);
    }
    else {
      sVar18 = Token::trivia(&local_2d8);
      if (sVar18._M_extent._M_extent_value._M_extent_value != 0) {
        SVar7 = Token::location(&local_280);
        ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x4b0005,
                            (SourceLocation)
                            ((long)SVar7 * 0x10 + 0x100000000 >> 4 & 0xfffffffff0000000U |
                            (ulong)(SVar7._0_4_ & 0xfffffff)));
      }
    }
LAB_003e63bc:
    bVar2 = false;
  }
  else {
    TVar15 = ParserBase::peek(&this->super_ParserBase);
    if (TVar15.kind == EqualsArrow) {
      local_2d8 = ParserBase::consume(&this->super_ParserBase);
      goto LAB_003e63bc;
    }
    if (TVar15.kind != StarArrow) {
      buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>._0_16_ =
           ParserBase::peek(&this->super_ParserBase);
      SVar7 = Token::location((Token *)&buffer);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x4b0005,SVar7);
      buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>._0_16_ =
           ParserBase::peek(&this->super_ParserBase);
      SVar7 = Token::location((Token *)&buffer);
      kind = EqualsArrow;
      goto LAB_003e63a6;
    }
    local_2d8 = ParserBase::consume(&this->super_ParserBase);
    bVar2 = true;
  }
  sVar19._M_extent._M_extent_value = local_2b0._M_extent_value;
  sVar19._M_ptr = sVar17._M_ptr;
  parsePathDeclaration::anon_class_8_1_8991fb9c::operator()(&checkTerminals,sVar19,bVar2);
  bVar1 = ParserBase::peek(&this->super_ParserBase,OpenParenthesis);
  if (bVar1) {
    TVar15 = ParserBase::consume(&this->super_ParserBase);
    sVar19 = parsePathTerminals(this);
    TVar16 = parsePathDeclaration::anon_class_8_1_8991fb9c::operator()(&parsePolarity);
    Token::Token(&local_258._M_first._M_storage);
    if ((TVar16.info == (Info *)0x0) &&
       ((bVar1 = ParserBase::peek(&this->super_ParserBase,PlusColon), bVar1 ||
        (bVar1 = ParserBase::peek(&this->super_ParserBase,MinusColon), bVar1)))) {
      TVar16 = ParserBase::consume(&this->super_ParserBase);
    }
    else {
      local_270 = TVar16._0_8_;
      local_258._M_first._M_storage =
           (_Uninitialized<slang::parsing::Token,_true>)
           ParserBase::expect(&this->super_ParserBase,Colon);
      TVar16.info = TVar16.info;
      TVar16.kind = (undefined2)local_270;
      TVar16._2_1_ = local_270._2_1_;
      TVar16.numFlags.raw = local_270._3_1_;
      TVar16.rawLen = local_270._4_4_;
    }
    local_270 = TVar16._0_8_;
    pEVar5 = parseExpression(this);
    TVar20 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
    buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.len._0_4_ = 3;
    buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.cap = 0;
    buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[0] = '\0';
    buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[1] = '\0';
    buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[2] = '\0';
    buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[3] = '\0';
    buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[4] = '\0';
    buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[5] = '\0';
    buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[6] = '\0';
    buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[7] = '\0';
    buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.data_ =
         (pointer)&PTR_getChild_00678fc8;
    polarityOperator.info = TVar16.info;
    polarityOperator.kind = (undefined2)local_270;
    polarityOperator._2_1_ = local_270._2_1_;
    polarityOperator.numFlags.raw = local_270._3_1_;
    polarityOperator.rawLen = local_270._4_4_;
    buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement._8_8_ =
         sVar19._M_extent._M_extent_value._M_extent_value;
    buffer._40_16_ = sVar19;
    suffix = slang::syntax::SyntaxFactory::edgeSensitivePathSuffix
                       (&this->factory,TVar15,
                        (SeparatedSyntaxList<slang::syntax::NameSyntax> *)&buffer,polarityOperator,
                        (Token)local_258._M_first._M_storage,pEVar5,TVar20);
    parsePathDeclaration::anon_class_8_1_8991fb9c::operator()(&checkTerminals,sVar19,bVar2);
  }
  else {
    sVar19 = parsePathTerminals(this);
    buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement._8_8_ =
         sVar19._M_extent._M_extent_value;
    buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.len._0_4_ = 3;
    buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.cap = 0;
    buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[0] = '\0';
    buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[1] = '\0';
    buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[2] = '\0';
    buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[3] = '\0';
    buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[4] = '\0';
    buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[5] = '\0';
    buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[6] = '\0';
    buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[7] = '\0';
    buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.data_ =
         (pointer)&PTR_getChild_00678fc8;
    buffer._40_16_ = sVar19;
    suffix = (EdgeSensitivePathSuffixSyntax *)
             slang::syntax::SyntaxFactory::simplePathSuffix
                       (&this->factory,(SeparatedSyntaxList<slang::syntax::NameSyntax> *)&buffer);
    parsePathDeclaration::anon_class_8_1_8991fb9c::operator()(&checkTerminals,sVar19,bVar2);
  }
  TVar15 = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
  pIVar10 = (Info *)&this->factory;
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.len._0_4_ = 3;
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.cap = 0;
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[0] = '\0';
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[1] = '\0';
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[2] = '\0';
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[3] = '\0';
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[4] = '\0';
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[5] = '\0';
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[6] = '\0';
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[7] = '\0';
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[8] =
       (undefined1)local_2b0._M_extent_value;
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[9] =
       local_2b0._M_extent_value._1_1_;
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[10] =
       local_2b0._M_extent_value._2_1_;
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[0xb] =
       local_2b0._M_extent_value._3_1_;
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[0xc] =
       local_2b0._M_extent_value._4_1_;
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[0xd] =
       local_2b0._M_extent_value._5_1_;
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[0xe] =
       local_2b0._M_extent_value._6_1_;
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[0xf] =
       local_2b0._M_extent_value._7_1_;
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.data_ = (pointer)&PTR_getChild_00678fc8
  ;
  buffer.stackBase[0] = (undefined1)local_2b0._M_extent_value;
  buffer.stackBase[1] = local_2b0._M_extent_value._1_1_;
  buffer.stackBase[2] = local_2b0._M_extent_value._2_1_;
  buffer.stackBase[3] = local_2b0._M_extent_value._3_1_;
  buffer.stackBase[4] = local_2b0._M_extent_value._4_1_;
  buffer.stackBase[5] = local_2b0._M_extent_value._5_1_;
  buffer.stackBase[6] = local_2b0._M_extent_value._6_1_;
  buffer.stackBase[7] = local_2b0._M_extent_value._7_1_;
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement._16_8_ = sVar17._M_ptr;
  openParen.info = local_2b8;
  openParen.kind = (short)uVar4;
  openParen._2_1_ = (char)((ulong)uVar4 >> 0x10);
  openParen.numFlags.raw = (char)((ulong)uVar4 >> 0x18);
  openParen.rawLen = (int)((ulong)uVar4 >> 0x20);
  edgeIdentifier.info = local_2c8;
  edgeIdentifier._0_8_ = local_2c0;
  desc = slang::syntax::SyntaxFactory::pathDescription
                   ((SyntaxFactory *)pIVar10,openParen,edgeIdentifier,
                    (SeparatedSyntaxList<slang::syntax::NameSyntax> *)&buffer,local_280,local_2d8,
                    &suffix->super_PathSuffixSyntax,TVar15);
  TVar15 = ParserBase::expect(&this->super_ParserBase,Equals);
  local_2b0._M_extent_value = (size_t)TVar15.info;
  pIVar6 = TVar15._0_8_;
  Token::Token(&local_290);
  Token::Token(&valueOpenParen);
  Token::Token(&valueCloseParen);
  bVar2 = ParserBase::peek(&this->super_ParserBase,OpenParenthesis);
  if (bVar2) {
    valueOpenParen = ParserBase::expect(&this->super_ParserBase,OpenParenthesis);
    if ((valueOpenParen._0_4_ >> 0x10 & 1) == 0) {
      buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.len = 0;
      buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.data_ =
           (pointer)buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement;
      buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.cap = 0x10;
      local_2c8 = pIVar6;
      local_2c0 = desc;
      local_2b8 = pIVar10;
      TVar15 = ParserBase::peek(&this->super_ParserBase);
      current = TVar15;
      bVar2 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar15.kind);
      if (bVar2) {
        bVar2 = ParserBase::haveDiagAtCurrentLoc(&this->super_ParserBase);
        if (!bVar2) {
          SVar7 = Token::location(&current);
          ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x10001,SVar7);
        }
LAB_003e6752:
        valueCloseParen = ParserBase::expect(&this->super_ParserBase,CloseParenthesis);
        pIVar10 = valueCloseParen.info;
      }
      else {
        bVar2 = slang::syntax::SyntaxFacts::isPossibleExpressionOrComma(TVar15.kind);
        if (bVar2) {
          do {
            do {
              pIVar10 = TVar15.info;
              pEVar5 = parseMinTypMaxExpression
                                 (this,(bitmask<slang::parsing::detail::ExpressionOptions>)0x0);
              local_258._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pEVar5;
              local_248 = CONCAT71(local_248._1_7_,1);
              SmallVectorBase<slang::syntax::TokenOrSyntax>::
              emplace_back<slang::syntax::TokenOrSyntax>
                        (&buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                         (TokenOrSyntax *)&local_258._M_first);
              TVar16 = ParserBase::peek(&this->super_ParserBase);
              TVar14 = TVar16.kind;
              bVar2 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar14);
              if (TVar14 == EndOfFile || bVar2) goto LAB_003e6752;
              if (TVar14 != Comma) {
                ParserBase::expect(&this->super_ParserBase,Comma);
                do {
                  bVar2 = ParserBase::
                          skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleExpressionOrComma,&slang::syntax::SyntaxFacts::isEndOfParenList>
                                    (&this->super_ParserBase,(DiagCode)0x10001,false);
                  if (!bVar2) goto LAB_003e6752;
                  bVar2 = ParserBase::peek(&this->super_ParserBase,Comma);
                } while (!bVar2);
              }
              local_258._M_first._M_storage =
                   (_Uninitialized<slang::parsing::Token,_true>)
                   ParserBase::expect(&this->super_ParserBase,Comma);
              local_248 = local_248 & 0xffffffffffffff00;
              SmallVectorBase<slang::syntax::TokenOrSyntax>::
              emplace_back<slang::syntax::TokenOrSyntax>
                        (&buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                         (TokenOrSyntax *)&local_258._M_first);
              TVar16 = ParserBase::peek(&this->super_ParserBase);
              pIVar6 = TVar16.info;
              TVar14 = TVar16.kind;
              bVar2 = slang::syntax::SyntaxFacts::isEndOfParenList(TVar14);
              if (TVar14 == EndOfFile || bVar2) {
                ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
                goto LAB_003e6752;
              }
              TVar11 = TVar15.kind;
              uVar12 = TVar16._0_8_ & 0xffffffff;
              TVar15.info = pIVar6;
              TVar15.kind = (short)uVar12;
              TVar15._2_1_ = (char)(uVar12 >> 0x10);
              TVar15.numFlags.raw = (char)(uVar12 >> 0x18);
              TVar15.rawLen = (int)(uVar12 >> 0x20);
            } while (pIVar10 != pIVar6 || TVar11 != TVar14);
            bVar2 = ParserBase::
                    skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleExpressionOrComma,&slang::syntax::SyntaxFacts::isEndOfParenList>
                              (&this->super_ParserBase,(DiagCode)0x10001,true);
            uVar12 = TVar16._0_8_ & 0xffffffff;
            TVar15.kind = (short)uVar12;
            TVar15._2_1_ = (char)(uVar12 >> 0x10);
            TVar15.numFlags.raw = (char)(uVar12 >> 0x18);
            TVar15.rawLen = (int)(uVar12 >> 0x20);
          } while (bVar2);
          goto LAB_003e6752;
        }
        ParserBase::reportMissingList
                  (&this->super_ParserBase,TVar15,CloseParenthesis,&valueCloseParen,
                   (DiagCode)0x10001);
        pIVar10 = extraout_RDX_00;
      }
      pBVar13 = (this->super_ParserBase).alloc;
      iVar3 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                        (&buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                         (EVP_PKEY_CTX *)pBVar13,(EVP_PKEY_CTX *)pIVar10);
      lVar8 = CONCAT44(extraout_var,iVar3);
      SmallVectorBase<slang::syntax::TokenOrSyntax>::cleanup
                (&buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,(EVP_PKEY_CTX *)pBVar13
                );
      pIVar6 = local_2c8;
      pIVar10 = local_2b8;
      desc = local_2c0;
      uVar12 = extraout_RDX_01;
    }
    else {
      SVar7 = Token::location(&valueOpenParen);
      valueCloseParen = ParserBase::missingToken(&this->super_ParserBase,CloseParenthesis,SVar7);
      lVar8 = 0;
      uVar12 = 0;
    }
    local_290 = ParserBase::expect(&this->super_ParserBase,Semicolon);
    goto LAB_003e6b50;
  }
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.len = 0;
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.data_ =
       (pointer)buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement;
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.cap = 4;
  local_2c8 = pIVar6;
  local_2c0 = desc;
  local_2b8 = pIVar10;
  TVar20 = ParserBase::peek(&this->super_ParserBase);
  current = TVar20;
  bVar2 = slang::syntax::SyntaxFacts::isSemicolon(TVar20.kind);
  if (bVar2) {
    bVar2 = ParserBase::haveDiagAtCurrentLoc(&this->super_ParserBase);
    if (!bVar2) {
      SVar7 = Token::location(&current);
      ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0x10001,SVar7);
    }
LAB_003e6b03:
    local_290 = ParserBase::expect(&this->super_ParserBase,Semicolon);
    pIVar10 = local_290.info;
  }
  else {
    bVar2 = slang::syntax::SyntaxFacts::isPossibleExpressionOrComma(TVar20.kind);
    if (bVar2) {
      do {
        do {
          pIVar10 = TVar20.info;
          pEVar5 = parseMinTypMaxExpression
                             (this,(bitmask<slang::parsing::detail::ExpressionOptions>)0x0);
          local_258._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)pEVar5;
          local_248 = CONCAT71(local_248._1_7_,1);
          SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                    (&buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                     (TokenOrSyntax *)&local_258._M_first);
          TVar15 = ParserBase::peek(&this->super_ParserBase);
          bVar2 = slang::syntax::SyntaxFacts::isSemicolon(TVar15.kind);
          if (TVar15.kind != Comma || bVar2) goto LAB_003e6b03;
          local_258._M_first._M_storage =
               (_Uninitialized<slang::parsing::Token,_true>)
               ParserBase::expect(&this->super_ParserBase,Comma);
          local_248 = local_248 & 0xffffffffffffff00;
          SmallVectorBase<slang::syntax::TokenOrSyntax>::emplace_back<slang::syntax::TokenOrSyntax>
                    (&buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                     (TokenOrSyntax *)&local_258._M_first);
          TVar15 = ParserBase::peek(&this->super_ParserBase);
          pIVar6 = TVar15.info;
          TVar14 = TVar15.kind;
          bVar2 = slang::syntax::SyntaxFacts::isSemicolon(TVar14);
          if (TVar14 == EndOfFile || bVar2) {
            ParserBase::reportMisplacedSeparator(&this->super_ParserBase);
            goto LAB_003e6b03;
          }
          TVar11 = TVar20.kind;
          uVar12 = TVar15._0_8_ & 0xffffffff;
          TVar20.info = pIVar6;
          TVar20.kind = (short)uVar12;
          TVar20._2_1_ = (char)(uVar12 >> 0x10);
          TVar20.numFlags.raw = (char)(uVar12 >> 0x18);
          TVar20.rawLen = (int)(uVar12 >> 0x20);
        } while (pIVar10 != pIVar6 || TVar11 != TVar14);
        bVar2 = ParserBase::
                skipBadTokens<&slang::syntax::SyntaxFacts::isPossibleExpressionOrComma,&slang::syntax::SyntaxFacts::isSemicolon>
                          (&this->super_ParserBase,(DiagCode)0x10001,true);
        uVar12 = TVar15._0_8_ & 0xffffffff;
        TVar20.kind = (short)uVar12;
        TVar20._2_1_ = (char)(uVar12 >> 0x10);
        TVar20.numFlags.raw = (char)(uVar12 >> 0x18);
        TVar20.rawLen = (int)(uVar12 >> 0x20);
      } while (bVar2);
      goto LAB_003e6b03;
    }
    ParserBase::reportMissingList
              (&this->super_ParserBase,TVar20,Semicolon,&local_290,(DiagCode)0x10001);
    pIVar10 = extraout_RDX;
  }
  pBVar13 = (this->super_ParserBase).alloc;
  iVar3 = SmallVectorBase<slang::syntax::TokenOrSyntax>::copy
                    (&buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,
                     (EVP_PKEY_CTX *)pBVar13,(EVP_PKEY_CTX *)pIVar10);
  lVar8 = CONCAT44(extraout_var_00,iVar3);
  SmallVectorBase<slang::syntax::TokenOrSyntax>::cleanup
            (&buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>,(EVP_PKEY_CTX *)pBVar13);
  pIVar6 = local_2c8;
  pIVar10 = local_2b8;
  desc = local_2c0;
  uVar12 = extraout_RDX_02;
LAB_003e6b50:
  if ((0x17 < uVar12) || ((0x80082bUL >> (uVar12 & 0x3f) & 1) == 0)) {
    this_01 = (TokenOrSyntax *)(lVar8 + (uVar12 - 1) * 0x18);
    if (*(char *)(lVar8 + (uVar12 - 1) * 0x18 + 0x10) == '\x01') {
      this_00 = slang::syntax::TokenOrSyntax::node(this_01);
      range = slang::syntax::SyntaxNode::sourceRange(this_00);
    }
    else {
      buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>._0_16_ =
           slang::syntax::ConstTokenOrSyntax::token((ConstTokenOrSyntax *)this_01);
      range = Token::range((Token *)&buffer);
    }
    ParserBase::addDiag(&this->super_ParserBase,(DiagCode)0xbf0005,range);
  }
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.len._0_4_ = 1;
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.cap = 0;
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[0] = '\0';
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[1] = '\0';
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[2] = '\0';
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[3] = '\0';
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[4] = '\0';
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[5] = '\0';
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[6] = '\0';
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[7] = '\0';
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[8] = '\0';
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[9] = '\0';
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[10] = '\0';
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[0xb] = '\0';
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[0xc] = '\0';
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[0xd] = '\0';
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[0xe] = '\0';
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.firstElement[0xf] = '\0';
  buffer._40_16_ = ZEXT816(0);
  buffer.super_SmallVectorBase<slang::syntax::TokenOrSyntax>.data_ = (pointer)&PTR_getChild_00678c10
  ;
  local_258._8_4_ = 3;
  local_248 = 0;
  uStack_240 = 0;
  local_258._M_rest = (_Variadic_union<const_slang::syntax::SyntaxNode_*>)&PTR_getChild_00679298;
  equals.info = (Info *)local_2b0._M_extent_value;
  equals._0_8_ = pIVar6;
  local_238 = uVar12;
  local_230 = lVar8;
  local_228 = uVar12;
  pPVar9 = slang::syntax::SyntaxFactory::pathDeclaration
                     ((SyntaxFactory *)pIVar10,
                      (SyntaxList<slang::syntax::AttributeInstanceSyntax> *)&buffer,desc,equals,
                      valueOpenParen,
                      (SeparatedSyntaxList<slang::syntax::ExpressionSyntax> *)&local_258._M_first,
                      valueCloseParen,local_290);
  return pPVar9;
}

Assistant:

PathDeclarationSyntax& Parser::parsePathDeclaration() {
    auto parsePolarity = [&] {
        switch (peek().kind) {
            case TokenKind::Plus:
            case TokenKind::Minus:
                return consume();
            default:
                return Token();
        }
    };

    auto checkTerminals = [&](std::span<TokenOrSyntax> terminals, bool isFull) {
        if (!isFull && terminals.size() > 2) {
            Token first = terminals[2].node()->getFirstToken();
            Token last = terminals.back().node()->getLastToken();
            addDiag(diag::MultipleParallelTerminals,
                    SourceRange{first.location(), last.location() + last.rawText().length()});
        }
    };

    auto openParen = expect(TokenKind::OpenParenthesis);
    auto edge = parseEdgeKeyword();
    auto inputs = parsePathTerminals();
    auto polarity = parsePolarity();

    // In specify blocks, +=> (and -=>) should be parsed as '+' and '=>',
    // but of course the lexer tokenizes it as '+=' and '>' so we need to
    // work around that here.
    Token op;
    bool isFull = false;
    if (!polarity && (peek(TokenKind::PlusEqual) || peek(TokenKind::MinusEqual))) {
        polarity = consume();
        op = consumeIf(TokenKind::GreaterThan);
        if (!op) {
            addDiag(diag::ExpectedPathOp, polarity.location() + 1);
            op = missingToken(TokenKind::GreaterThan, peek().location());
        }
        else if (!op.trivia().empty()) {
            addDiag(diag::ExpectedPathOp, polarity.location() + 1);
        }
    }
    else {
        switch (peek().kind) {
            case TokenKind::StarArrow:
                isFull = true;
                op = consume();
                break;
            case TokenKind::EqualsArrow:
                op = consume();
                break;
            default:
                addDiag(diag::ExpectedPathOp, peek().location());
                op = missingToken(TokenKind::EqualsArrow, peek().location());
                break;
        }
    }

    checkTerminals(inputs, isFull);

    PathSuffixSyntax* suffix;
    if (peek(TokenKind::OpenParenthesis)) {
        auto suffixOpenParen = consume();
        auto outputs = parsePathTerminals();
        auto polarity2 = parsePolarity();

        // The polarity we just tried to parse could have been a '+' or a '-' next
        // to the expected colon, which would get lexed together as a single token.
        // In that case don't bother trying to find another colon token.
        Token colon;
        if (!polarity2 && (peek(TokenKind::PlusColon) || peek(TokenKind::MinusColon)))
            polarity2 = consume();
        else
            colon = expect(TokenKind::Colon);

        auto& expr = parseExpression();
        auto suffixCloseParen = expect(TokenKind::CloseParenthesis);
        suffix = &factory.edgeSensitivePathSuffix(suffixOpenParen, outputs, polarity2, colon, expr,
                                                  suffixCloseParen);

        checkTerminals(outputs, isFull);
    }
    else {
        auto outputs = parsePathTerminals();
        suffix = &factory.simplePathSuffix(outputs);
        checkTerminals(outputs, isFull);
    }

    auto closeParen = expect(TokenKind::CloseParenthesis);
    auto& desc = factory.pathDescription(openParen, edge, inputs, polarity, op, *suffix,
                                         closeParen);

    auto equals = expect(TokenKind::Equals);

    Token semi;
    Token valueOpenParen, valueCloseParen;
    std::span<TokenOrSyntax> delays;

    if (peek(TokenKind::OpenParenthesis)) {
        parseList<isPossibleExpressionOrComma, isEndOfParenList>(
            TokenKind::OpenParenthesis, TokenKind::CloseParenthesis, TokenKind::Comma,
            valueOpenParen, delays, valueCloseParen, RequireItems::True, diag::ExpectedExpression,
            [this] { return &parseMinTypMaxExpression(); });
        semi = expect(TokenKind::Semicolon);
    }
    else {
        SmallVector<TokenOrSyntax, 4> buffer;
        parseList<isPossibleExpressionOrComma, isSemicolon>(
            buffer, TokenKind::Semicolon, TokenKind::Comma, semi, RequireItems::True,
            diag::ExpectedExpression, [this] { return &parseMinTypMaxExpression(); });
        delays = buffer.copy(alloc);
    }

    if (delays.size() > 0 && delays.size() != 1 && delays.size() != 3 && delays.size() != 5 &&
        delays.size() != 11 && delays.size() != 23) {
        auto& lastDelay = delays.back();
        auto range = lastDelay.isNode() ? lastDelay.node()->sourceRange()
                                        : lastDelay.token().range();
        addDiag(diag::WrongSpecifyDelayCount, range);
    }

    return factory.pathDeclaration(nullptr, desc, equals, valueOpenParen, delays, valueCloseParen,
                                   semi);
}